

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

bool __thiscall
cmNinjaTargetGenerator::SetMsvcTargetPdbVariable
          (cmNinjaTargetGenerator *this,cmNinjaVars *vars,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  cmLocalNinjaGenerator *pcVar2;
  bool bVar3;
  TargetType TVar4;
  cmValue cVar5;
  cmValue cVar6;
  cmGlobalNinjaGenerator *pcVar7;
  string *psVar8;
  mapped_type *pmVar9;
  bool bVar10;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view source;
  string_view source_00;
  string pdbPath;
  string compilePdbPath;
  string local_190;
  undefined1 *local_170;
  undefined8 local_168;
  size_type local_160;
  pointer local_158;
  string *local_150;
  string local_148;
  string local_128;
  key_type local_108;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"MSVC_C_ARCHITECTURE_ID","");
  cVar5 = cmMakefile::GetDefinition(this_00,&local_190);
  bVar10 = true;
  if (cVar5.Value == (string *)0x0) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_128,"MSVC_CXX_ARCHITECTURE_ID","");
    cVar6 = cmMakefile::GetDefinition(this_00,&local_128);
    if (cVar6.Value == (string *)0x0) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"MSVC_CUDA_ARCHITECTURE_ID","");
      cVar6 = cmMakefile::GetDefinition(this_00,&local_70);
      bVar10 = cVar6.Value != (string *)0x0;
      bVar3 = true;
      goto LAB_0046b70d;
    }
  }
  bVar3 = false;
LAB_0046b70d:
  if ((bVar3) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2)) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((cVar5.Value == (string *)0x0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2)) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,(ulong)(local_190.field_2._M_allocated_capacity + 1))
    ;
  }
  if (bVar10) {
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    local_148._M_string_length = 0;
    local_148.field_2._M_local_buf[0] = '\0';
    cmCommonTargetGenerator::ComputeTargetCompilePDB
              (&local_90,&this->super_cmCommonTargetGenerator,config);
    TVar4 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget);
    if ((((TVar4 == EXECUTABLE) ||
         (TVar4 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget),
         TVar4 == STATIC_LIBRARY)) ||
        (TVar4 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget),
        TVar4 == SHARED_LIBRARY)) ||
       (TVar4 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget),
       TVar4 == MODULE_LIBRARY)) {
      cmGeneratorTarget::GetPDBDirectory
                (&local_b0,(this->super_cmCommonTargetGenerator).GeneratorTarget,config);
      cmGeneratorTarget::GetPDBName
                (&local_d0,(this->super_cmCommonTargetGenerator).GeneratorTarget,config);
      local_190._M_dataplus._M_p = (pointer)local_b0._M_string_length;
      local_190._M_string_length = (size_type)local_b0._M_dataplus._M_p;
      local_170 = (undefined1 *)((long)&local_108.field_2 + 8);
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 1;
      local_108.field_2._M_local_buf[8] = '/';
      local_190.field_2._8_8_ = 1;
      local_168 = 0;
      local_160 = local_d0._M_string_length;
      local_158 = local_d0._M_dataplus._M_p;
      views._M_len = 3;
      views._M_array = (iterator)&local_190;
      local_190.field_2._M_allocated_capacity = (size_type)&local_b0;
      local_150 = &local_d0;
      local_108.field_2._M_allocated_capacity = (size_type)local_170;
      cmCatViews(&local_50,views);
      std::__cxx11::string::operator=((string *)&local_148,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar2 = this->LocalGenerator;
    pcVar7 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar2);
    psVar8 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar7,&local_148);
    source._M_str = (psVar8->_M_dataplus)._M_p;
    source._M_len = psVar8->_M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_190,(cmOutputConverter *)pcVar2,source,SHELL,false);
    paVar1 = &local_108.field_2;
    local_108._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"TARGET_PDB","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars,&local_108);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar1) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,
                      (ulong)(local_190.field_2._M_allocated_capacity + 1));
    }
    pcVar2 = this->LocalGenerator;
    pcVar7 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar2);
    psVar8 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar7,&local_90);
    source_00._M_str = (psVar8->_M_dataplus)._M_p;
    source_00._M_len = psVar8->_M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_190,(cmOutputConverter *)pcVar2,source_00,SHELL,false);
    local_108._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"TARGET_COMPILE_PDB","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars,&local_108);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar1) {
      operator_delete(local_108._M_dataplus._M_p,
                      (ulong)(local_108.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,
                      (ulong)(local_190.field_2._M_allocated_capacity + 1));
    }
    EnsureParentDirectoryExists(this,&local_148);
    EnsureParentDirectoryExists(this,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,
                      CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                               local_148.field_2._M_local_buf[0]) + 1);
    }
    return bVar10;
  }
  return bVar10;
}

Assistant:

bool cmNinjaTargetGenerator::SetMsvcTargetPdbVariable(
  cmNinjaVars& vars, const std::string& config) const
{
  cmMakefile* mf = this->GetMakefile();
  if (mf->GetDefinition("MSVC_C_ARCHITECTURE_ID") ||
      mf->GetDefinition("MSVC_CXX_ARCHITECTURE_ID") ||
      mf->GetDefinition("MSVC_CUDA_ARCHITECTURE_ID")) {
    std::string pdbPath;
    std::string compilePdbPath = this->ComputeTargetCompilePDB(config);
    if (this->GeneratorTarget->GetType() == cmStateEnums::EXECUTABLE ||
        this->GeneratorTarget->GetType() == cmStateEnums::STATIC_LIBRARY ||
        this->GeneratorTarget->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->GeneratorTarget->GetType() == cmStateEnums::MODULE_LIBRARY) {
      pdbPath = cmStrCat(this->GeneratorTarget->GetPDBDirectory(config), '/',
                         this->GeneratorTarget->GetPDBName(config));
    }

    vars["TARGET_PDB"] = this->GetLocalGenerator()->ConvertToOutputFormat(
      this->ConvertToNinjaPath(pdbPath), cmOutputConverter::SHELL);
    vars["TARGET_COMPILE_PDB"] =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        this->ConvertToNinjaPath(compilePdbPath), cmOutputConverter::SHELL);

    this->EnsureParentDirectoryExists(pdbPath);
    this->EnsureParentDirectoryExists(compilePdbPath);
    return true;
  }
  return false;
}